

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O2

uint Kit_GraphToTruth(Kit_Graph_t *pGraph)

{
  Kit_Edge_t KVar1;
  uint uVar2;
  Kit_Node_t *pKVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  
  uVar8 = pGraph->nLeaves;
  if ((int)uVar8 < 0) {
    __assert_fail("Kit_GraphLeaveNum(pGraph) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitGraph.c"
                  ,0x13a,"unsigned int Kit_GraphToTruth(Kit_Graph_t *)");
  }
  if ((int)uVar8 <= pGraph->nSize) {
    if (uVar8 < 6) {
      KVar1 = pGraph->eRoot;
      if (pGraph->fConst == 0) {
        if (((uint)KVar1 >> 1 & 0x3fffffff) < uVar8) {
          iVar4 = Kit_GraphVarInt(pGraph);
          uVar8 = -((uint)KVar1 & 1) ^ (&DAT_0081cf00)[iVar4];
        }
        else {
          lVar6 = 2;
          puVar7 = &DAT_0081cf00;
          for (lVar10 = 0; lVar5 = (long)(int)uVar8, lVar10 < lVar5; lVar10 = lVar10 + 1) {
            *(ulong *)(&pGraph->pNodes->eEdge0 + lVar6) = (ulong)*puVar7;
            uVar8 = pGraph->nLeaves;
            lVar6 = lVar6 + 6;
            puVar7 = puVar7 + 1;
          }
          lVar6 = lVar5 * 0x18 + 8;
          uVar9 = 0;
          for (; lVar5 < pGraph->nSize; lVar5 = lVar5 + 1) {
            pKVar3 = pGraph->pNodes;
            uVar8 = *(uint *)((long)pKVar3 + lVar6 + -8);
            uVar2 = *(uint *)((long)pKVar3 + lVar6 + -4);
            uVar9 = (ulong)((-(uVar2 & 1) ^ pKVar3[uVar2 >> 1 & 0x3fffffff].field_2.iFunc) &
                           (-(uVar8 & 1) ^ pKVar3[uVar8 >> 1 & 0x3fffffff].field_2.iFunc));
            *(ulong *)(&(pKVar3->eEdge0).field_0x0 + lVar6) = uVar9;
            lVar6 = lVar6 + 0x18;
          }
          uVar8 = (uint)uVar9 ^ -((uint)pGraph->eRoot & 1);
        }
      }
      else {
        uVar8 = ((uint)KVar1 & 1) - 1;
      }
      return uVar8;
    }
    __assert_fail("Kit_GraphLeaveNum(pGraph) <= 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitGraph.c"
                  ,0x13c,"unsigned int Kit_GraphToTruth(Kit_Graph_t *)");
  }
  __assert_fail("Kit_GraphLeaveNum(pGraph) <= pGraph->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitGraph.c"
                ,0x13b,"unsigned int Kit_GraphToTruth(Kit_Graph_t *)");
}

Assistant:

unsigned Kit_GraphToTruth( Kit_Graph_t * pGraph )
{
    unsigned uTruths[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    unsigned uTruth = 0, uTruth0, uTruth1;
    Kit_Node_t * pNode;
    int i;

    // sanity checks
    assert( Kit_GraphLeaveNum(pGraph) >= 0 );
    assert( Kit_GraphLeaveNum(pGraph) <= pGraph->nSize );
    assert( Kit_GraphLeaveNum(pGraph) <= 5 );

    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Kit_GraphIsComplement(pGraph)? 0 : ~((unsigned)0);
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Kit_GraphIsComplement(pGraph)? ~uTruths[Kit_GraphVarInt(pGraph)] : uTruths[Kit_GraphVarInt(pGraph)];

    // assign the elementary variables
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = (void *)(long)uTruths[i];

    // compute the function for each internal node
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        uTruth0 = (unsigned)(long)Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc;
        uTruth1 = (unsigned)(long)Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc;
        uTruth0 = pNode->eEdge0.fCompl? ~uTruth0 : uTruth0;
        uTruth1 = pNode->eEdge1.fCompl? ~uTruth1 : uTruth1;
        uTruth = uTruth0 & uTruth1;
        pNode->pFunc = (void *)(long)uTruth;
    }

    // complement the result if necessary
    return Kit_GraphIsComplement(pGraph)? ~uTruth : uTruth;
}